

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::erase
          (Data<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node> *this,
          Bucket bucket)

{
  Span *pSVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Span *pSVar6;
  Span *pSVar7;
  Span *fromSpan;
  size_t fromIndex;
  size_t to;
  Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node> *this_00;
  QByteArrayView QVar8;
  
  Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::erase
            (bucket.span,bucket.index);
  this->size = this->size - 1;
  to = bucket.index;
  this_00 = bucket.span;
LAB_00560bc9:
  pSVar1 = this->spans;
  uVar2 = this->numBuckets;
  uVar3 = this->seed;
  uVar4 = uVar2 >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar4 == 0) {
          fromSpan = pSVar1;
        }
        fromIndex = 0;
      }
      uVar5 = (ulong)fromSpan->offsets[fromIndex];
      if (uVar5 == 0xff) {
        return;
      }
      QVar8.m_data = *(storage_type **)(fromSpan->entries[uVar5].storage.data + 0x18);
      QVar8.m_size = *(qsizetype *)(fromSpan->entries[uVar5].storage.data + 0x20);
      uVar5 = qHash(QVar8,uVar3);
      uVar5 = uVar5 & uVar2 - 1;
      pSVar6 = pSVar1 + (uVar5 >> 7);
      uVar5 = (ulong)((uint)uVar5 & 0x7f);
    } while (uVar5 == fromIndex && pSVar6 == fromSpan);
    do {
      if ((pSVar6 == this_00) && (uVar5 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::Node>::moveFromSpan
                    (this_00,fromSpan,fromIndex,to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_00560bc9;
      }
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x80) {
        pSVar7 = pSVar6 + 1;
        pSVar6 = pSVar1;
        if (((long)pSVar7 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - uVar4 != 0) {
          pSVar6 = pSVar7;
        }
        uVar5 = 0;
      }
    } while ((pSVar6 != fromSpan) || (uVar5 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }